

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

void __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::Animatable<bool>_>::TypedAttributeWithFallback
          (TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *this,
          TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *param_1)

{
  bool bVar1;
  
  AttrMetas::AttrMetas(&this->_metas,&param_1->_metas);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
            (&this->_paths,&param_1->_paths);
  bVar1 = (param_1->_attrib).has_value_;
  (this->_attrib).has_value_ = bVar1;
  if (bVar1 == true) {
    *(undefined1 *)((long)&(this->_attrib).contained + 2) =
         *(undefined1 *)((long)&(param_1->_attrib).contained + 2);
    *(undefined2 *)&(this->_attrib).contained = *(undefined2 *)&(param_1->_attrib).contained;
    ::std::
    vector<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
    ::vector((vector<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
              *)((long)&(this->_attrib).contained + 8),
             (vector<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
              *)((long)&(param_1->_attrib).contained + 8));
    *(undefined1 *)((long)&(this->_attrib).contained + 0x20) =
         *(undefined1 *)((long)&(param_1->_attrib).contained + 0x20);
  }
  this->_empty = param_1->_empty;
  bVar1 = (param_1->_fallback)._has_value;
  (this->_fallback)._value = (param_1->_fallback)._value;
  (this->_fallback)._has_value = bVar1;
  (this->_fallback)._blocked = (param_1->_fallback)._blocked;
  ::std::
  vector<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
  ::vector(&(this->_fallback)._ts._samples,&(param_1->_fallback)._ts._samples);
  (this->_fallback)._ts._dirty = (param_1->_fallback)._ts._dirty;
  this->_blocked = param_1->_blocked;
  return;
}

Assistant:

static std::string type_name() { return value::TypeTraits<T>::type_name(); }